

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O0

void __thiscall
MxxDistribution_BlockDistr_Test::~MxxDistribution_BlockDistr_Test
          (MxxDistribution_BlockDistr_Test *this)

{
  MxxDistribution_BlockDistr_Test *this_local;
  
  ~MxxDistribution_BlockDistr_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxDistribution, BlockDistr) {
    mxx::comm c;
    // create unequal distribution
    size_t size = std::max<long>(10, 100 - 10 * c.rank());
    std::vector<int> vec(size);

    // initialze with unique ids
    size_t prefix = mxx::exscan(size, c);
    size_t total_size = mxx::allreduce(size, c);
    std::srand(13*c.rank());
    for (size_t i = 0; i < size; ++i) {
        vec[i] = prefix+i;
    }

    // calculate expected distribution size
    size_t eq_size = total_size / c.size();
    if ((size_t)c.rank() < total_size % c.size())
        eq_size+=1;
    size_t eq_prefix = mxx::exscan(eq_size, c);

    // equally distribute (test inplace version after non-inplace version)
    std::vector<int> x = mxx::distribute(vec, c);
    mxx::distribute_inplace(vec, c);

    ASSERT_TRUE(mxx::all_of(eq_size == vec.size()));
    ASSERT_TRUE(mxx::all_of(eq_size == x.size()));

    // sort equally distributed vector
    mxx::sort(vec.begin(), vec.end());
    mxx::sort(x.begin(), x.end());

    // check that all values are still there
    for (size_t i = 0; i < vec.size(); ++i) {
        ASSERT_EQ(eq_prefix+i,(size_t)vec[i]);
        ASSERT_EQ(eq_prefix+i,(size_t)x[i]);
    }
}